

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::UnescapeCEscapeSequences
              (char *source,char *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  LogMessage *pLVar4;
  byte bVar5;
  byte bVar6;
  byte *pbVar7;
  byte *pbVar8;
  LogMessage local_70;
  LogFinisher local_31;
  
  pbVar8 = (byte *)dest;
  if (errors != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/strutil.cc"
               ,0x142);
    pLVar4 = internal::LogMessage::operator<<(&local_70,"CHECK failed: errors == nullptr: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,"Error reporting not implemented.");
    internal::LogFinisher::operator=(&local_31,pLVar4);
    internal::LogMessage::~LogMessage(&local_70);
  }
  for (; (((byte *)source == pbVar8 && (*source != 0)) && (*source != 0x5c));
      source = (char *)((byte *)source + 1)) {
    pbVar8 = pbVar8 + 1;
  }
  do {
    bVar6 = *source;
    if (bVar6 != 0x5c) {
      pbVar7 = (byte *)source;
      if (bVar6 != 0) goto LAB_002907fa;
LAB_0029081c:
      *pbVar8 = 0;
      return (int)pbVar8 - (int)dest;
    }
    pbVar7 = (byte *)source + 1;
    bVar6 = ((byte *)source)[1];
    if (bVar6 - 0x30 < 8) {
      bVar1 = bVar6 - 0x30;
      pbVar2 = pbVar7;
      if ((((byte *)source)[2] & 0xf8) == 0x30) {
        bVar1 = ((bVar6 - 0x30) * '\b' + ((byte *)source)[2]) - 0x30;
        pbVar2 = (byte *)source + 2;
      }
      pbVar7 = pbVar2 + 1;
      bVar6 = (bVar1 * '\b' + pbVar2[1]) - 0x30;
      if ((pbVar2[1] & 0xf8) != 0x30) {
        pbVar7 = pbVar2;
        bVar6 = bVar1;
      }
      goto LAB_002907fa;
    }
    switch(bVar6) {
    case 0x6e:
      bVar6 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
      goto switchD_00290792_caseD_6f;
    case 0x72:
      bVar6 = 0xd;
      break;
    case 0x74:
      bVar6 = 9;
      break;
    case 0x76:
      bVar6 = 0xb;
      break;
    case 0x78:
switchD_00290792_caseD_78:
      iVar3 = isxdigit((int)(char)((byte *)source)[2]);
      if ((char)iVar3 != '\0') {
        bVar6 = 0;
        while (iVar3 = isxdigit((int)(char)pbVar7[1]), (char)iVar3 != '\0') {
          pbVar7 = pbVar7 + 1;
          bVar1 = *pbVar7;
          bVar5 = bVar1 + 9;
          if (bVar1 < 0x3a) {
            bVar5 = bVar1;
          }
          bVar6 = bVar5 & 0xf | bVar6 << 4;
        }
        break;
      }
      goto switchD_00290792_caseD_6f;
    default:
      if (((bVar6 != 0x22) && (bVar6 != 0x27)) && (bVar6 != 0x3f)) {
        if (bVar6 == 0x58) goto switchD_00290792_caseD_78;
        if (bVar6 != 0x5c) {
          if (bVar6 == 0x61) {
            bVar6 = 7;
          }
          else if (bVar6 == 0x62) {
            bVar6 = 8;
          }
          else {
            if (bVar6 != 0x66) {
              if (bVar6 != 0) goto switchD_00290792_caseD_6f;
              goto LAB_0029081c;
            }
            bVar6 = 0xc;
          }
        }
      }
    }
LAB_002907fa:
    *pbVar8 = bVar6;
    pbVar8 = pbVar8 + 1;
switchD_00290792_caseD_6f:
    source = (char *)(pbVar7 + 1);
  } while( true );
}

Assistant:

int UnescapeCEscapeSequences(const char* source, char* dest,
                             std::vector<string> *errors) {
  GOOGLE_DCHECK(errors == nullptr) << "Error reporting not implemented.";

  char* d = dest;
  const char* p = source;

  // Small optimization for case where source = dest and there's no escaping
  while ( p == d && *p != '\0' && *p != '\\' )
    p++, d++;

  while (*p != '\0') {
    if (*p != '\\') {
      *d++ = *p++;
    } else {
      switch ( *++p ) {                    // skip past the '\\'
        case '\0':
          LOG_STRING(ERROR, errors) << "String cannot end with \\";
          *d = '\0';
          return d - dest;   // we're done with p
        case 'a':  *d++ = '\a';  break;
        case 'b':  *d++ = '\b';  break;
        case 'f':  *d++ = '\f';  break;
        case 'n':  *d++ = '\n';  break;
        case 'r':  *d++ = '\r';  break;
        case 't':  *d++ = '\t';  break;
        case 'v':  *d++ = '\v';  break;
        case '\\': *d++ = '\\';  break;
        case '?':  *d++ = '\?';  break;    // \?  Who knew?
        case '\'': *d++ = '\'';  break;
        case '"':  *d++ = '\"';  break;
        case '0': case '1': case '2': case '3':  // octal digit: 1 to 3 digits
        case '4': case '5': case '6': case '7': {
          char ch = *p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )
            ch = ch * 8 + *++p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )      // safe (and easy) to do this twice
            ch = ch * 8 + *++p - '0';      // now points at last digit
          *d++ = ch;
          break;
        }
        case 'x': case 'X': {
          if (!isxdigit(p[1])) {
            if (p[1] == '\0') {
              LOG_STRING(ERROR, errors) << "String cannot end with \\x";
            } else {
              LOG_STRING(ERROR, errors) <<
                "\\x cannot be followed by non-hex digit: \\" << *p << p[1];
            }
            break;
          }
          unsigned int ch = 0;
          const char *hex_start = p;
          while (isxdigit(p[1]))  // arbitrarily many hex digits
            ch = (ch << 4) + hex_digit_to_int(*++p);
          if (ch > 0xFF)
            LOG_STRING(ERROR, errors) << "Value of " <<
              "\\" << string(hex_start, p+1-hex_start) << " exceeds 8 bits";
          *d++ = ch;
          break;
        }
#if 0  // TODO(kenton):  Support \u and \U?  Requires runetochar().
        case 'u': {
          // \uhhhh => convert 4 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 4; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              rune = (rune << 4) + hex_digit_to_int(*++p);  // Advance p.
            } else {
              LOG_STRING(ERROR, errors)
                << "\\u must be followed by 4 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
        case 'U': {
          // \Uhhhhhhhh => convert 8 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 8; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              // Don't change rune until we're sure this
              // is within the Unicode limit, but do advance p.
              char32 newrune = (rune << 4) + hex_digit_to_int(*++p);
              if (newrune > 0x10FFFF) {
                LOG_STRING(ERROR, errors)
                  << "Value of \\"
                  << string(hex_start, p + 1 - hex_start)
                  << " exceeds Unicode limit (0x10FFFF)";
                break;
              } else {
                rune = newrune;
              }
            } else {
              LOG_STRING(ERROR, errors)
                << "\\U must be followed by 8 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
#endif
        default:
          LOG_STRING(ERROR, errors) << "Unknown escape sequence: \\" << *p;
      }
      p++;                                 // read past letter we escaped
    }
  }
  *d = '\0';
  return d - dest;
}